

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O2

void soul::RefCountedPtr<soul::Structure>::decIfNotNull(Structure *o)

{
  uint32_t uVar1;
  
  if (o != (Structure *)0x0) {
    uVar1 = (o->super_RefCountedObject).refCount;
    if (uVar1 == 0) {
      throwInternalCompilerError("o->refCount > 0","decIfNotNull",0x69);
    }
    uVar1 = uVar1 - 1;
    (o->super_RefCountedObject).refCount = uVar1;
    if (uVar1 == 0) {
      Structure::~Structure(o);
      operator_delete(o,0x288);
      return;
    }
  }
  return;
}

Assistant:

static void decIfNotNull (ObjectType* o)
    {
        if (o != nullptr)
        {
            SOUL_ASSERT (o->refCount > 0);

            if (--(o->refCount) == 0)
                delete o;
        }
    }